

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu_operations.c
# Opt level: O0

void alu_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  status_register_t *psVar5;
  ushort *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t newvalue_8;
  uint32_t newvalue_7;
  uint32_t result_6;
  uint32_t newvalue_6;
  uint32_t result_4;
  uint32_t rsdata_3;
  uint32_t rddata_2;
  uint32_t result_3;
  uint32_t rsdata_2;
  uint32_t shift_amount_3;
  uint32_t newvalue_5;
  uint32_t result_2;
  uint64_t tmp;
  uint32_t rsdata_1;
  uint32_t rddata_1;
  uint32_t result;
  uint64_t rsdata;
  uint64_t rddata;
  uint32_t shift_amount_2;
  uint32_t newvalue_4;
  uint32_t shift_amount_1;
  uint32_t newvalue_3;
  uint32_t shift_amount;
  uint32_t newvalue_2;
  uint32_t newvalue_1;
  uint32_t newvalue;
  alu_operations_t *instr;
  uint32_t value_31;
  uint32_t value_30;
  uint32_t value_29;
  uint32_t value_28;
  uint32_t value_27;
  uint32_t value_26;
  uint32_t value_25;
  uint32_t value_24;
  uint32_t value_23;
  uint32_t value_22;
  uint32_t value_21;
  uint32_t value_20;
  uint32_t value_19;
  uint32_t value_18;
  uint32_t value_17;
  uint32_t value_16;
  uint32_t value_15;
  uint32_t value_14;
  uint32_t value_13;
  uint32_t value_12;
  uint32_t value_11;
  uint32_t value_10;
  uint32_t value_9;
  uint32_t value_8;
  uint32_t value_7;
  uint32_t value_6;
  uint32_t value_5;
  uint32_t value_4;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  status_register_t *psr_15;
  status_register_t *psr_14;
  status_register_t *psr_13;
  status_register_t *psr_12;
  status_register_t *psr_11;
  status_register_t *psr_10;
  status_register_t *psr_9;
  status_register_t *psr_8;
  status_register_t *psr_7;
  status_register_t *psr_6;
  status_register_t *psr_5;
  status_register_t *psr_4;
  status_register_t *psr_3;
  status_register_t *psr_2;
  status_register_t *psr_1;
  status_register_t *psr;
  uint32_t result_1;
  uint32_t result_5;
  undefined8 in_stack_fffffffffffff1c8;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffff1d0;
  shift_type_t type;
  status_register_t *in_stack_fffffffffffff1d8;
  uint32_t local_a78;
  uint32_t local_a68;
  uint32_t local_a58;
  uint32_t local_a48;
  uint32_t local_a38;
  uint32_t local_a28;
  uint32_t local_a18;
  uint32_t local_a08;
  uint32_t local_9f8;
  uint32_t local_9e8;
  uint32_t local_9d8;
  uint32_t local_9c8;
  uint32_t local_9b8;
  uint32_t local_9a8;
  uint32_t local_998;
  uint32_t local_988;
  uint32_t local_978;
  uint32_t local_968;
  uint32_t local_958;
  uint32_t local_948;
  uint32_t local_938;
  uint32_t local_928;
  uint32_t local_918;
  uint32_t local_908;
  uint32_t local_8b8;
  uint32_t local_8a8;
  uint32_t local_898;
  uint32_t local_888;
  uint32_t local_58c;
  uint32_t local_57c;
  uint32_t local_56c;
  uint32_t local_55c;
  uint32_t local_50c;
  uint32_t local_4fc;
  uint32_t local_4ec;
  uint32_t local_4dc;
  uint32_t local_4cc;
  uint32_t local_4bc;
  uint32_t local_4ac;
  uint32_t local_49c;
  uint32_t local_48c;
  uint32_t local_47c;
  uint32_t local_46c;
  uint32_t local_45c;
  uint32_t local_44c;
  uint32_t local_43c;
  uint32_t local_42c;
  uint32_t local_41c;
  uint32_t local_40c;
  uint32_t local_3fc;
  uint32_t local_3ec;
  uint32_t local_3dc;
  uint32_t local_3cc;
  uint32_t local_3bc;
  uint32_t local_3ac;
  uint32_t local_39c;
  uint32_t local_38c;
  uint32_t local_37c;
  uint32_t local_36c;
  uint32_t local_35c;
  uint32_t local_30c;
  uint32_t local_2fc;
  uint32_t local_2ec;
  uint32_t local_2dc;
  uint32_t local_2cc;
  uint32_t local_2bc;
  uint32_t local_2ac;
  uint32_t local_29c;
  uint32_t local_28c;
  uint32_t local_27c;
  uint32_t local_26c;
  uint32_t local_25c;
  uint32_t local_24c;
  uint32_t local_23c;
  uint32_t local_22c;
  uint32_t local_21c;
  uint32_t local_20c;
  uint32_t local_1fc;
  uint32_t local_1ec;
  uint32_t local_1dc;
  uint32_t local_1cc;
  uint32_t local_1bc;
  uint32_t local_1ac;
  uint32_t local_1a0;
  
  new_pc = (uint32_t)((ulong)in_stack_fffffffffffff1c8 >> 0x20);
  type = (shift_type_t)((ulong)in_stack_fffffffffffff1d0 >> 0x20);
  switch(*in_RSI >> 6 & 0xf) {
  case 0:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_888 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_888 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_58c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_58c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_58c = in_RDI->sp_svc;
        break;
      default:
        local_58c = in_RDI->sp;
        break;
      case 0x17:
        local_58c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_58c = in_RDI->sp_und;
      }
      local_888 = local_58c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_38c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_38c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_38c = in_RDI->lr_svc;
        break;
      default:
        local_38c = in_RDI->lr;
        break;
      case 0x17:
        local_38c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_38c = in_RDI->lr_und;
      }
      local_888 = local_38c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_888 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_898 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_898 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_57c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_57c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_57c = in_RDI->sp_svc;
        break;
      default:
        local_57c = in_RDI->sp;
        break;
      case 0x17:
        local_57c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_57c = in_RDI->sp_und;
      }
      local_898 = local_57c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_37c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_37c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_37c = in_RDI->lr_svc;
        break;
      default:
        local_37c = in_RDI->lr;
        break;
      case 0x17:
        local_37c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_37c = in_RDI->lr_und;
      }
      local_898 = local_37c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_898 = in_RDI->pc;
    }
    uVar4 = local_888 & local_898;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 1:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_8a8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_8a8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_56c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_56c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_56c = in_RDI->sp_svc;
        break;
      default:
        local_56c = in_RDI->sp;
        break;
      case 0x17:
        local_56c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_56c = in_RDI->sp_und;
      }
      local_8a8 = local_56c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_36c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_36c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_36c = in_RDI->lr_svc;
        break;
      default:
        local_36c = in_RDI->lr;
        break;
      case 0x17:
        local_36c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_36c = in_RDI->lr_und;
      }
      local_8a8 = local_36c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_8a8 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_8b8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_8b8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_55c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_55c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_55c = in_RDI->sp_svc;
        break;
      default:
        local_55c = in_RDI->sp;
        break;
      case 0x17:
        local_55c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_55c = in_RDI->sp_und;
      }
      local_8b8 = local_55c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_35c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_35c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_35c = in_RDI->lr_svc;
        break;
      default:
        local_35c = in_RDI->lr;
        break;
      case 0x17:
        local_35c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_35c = in_RDI->lr_und;
      }
      local_8b8 = local_35c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_8b8 = in_RDI->pc;
    }
    uVar4 = local_8a8 ^ local_8b8;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 2:
    uVar4 = (uint)(*in_RSI & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar4 < 8)) || (0xc < uVar4)) && (0xc < uVar4))
    {
      if (uVar4 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar4 < 8)) || (0xc < uVar4)) && (0xc < uVar4))
    {
      if (uVar4 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
    }
    uVar3 = arm_shift(in_stack_fffffffffffff1d8,type,(uint32_t)in_stack_fffffffffffff1d0,new_pc);
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar3 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar3 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar3);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar3;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar3;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar3;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar3;
        break;
      default:
        in_RDI->sp = uVar3;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar3;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar3;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar3;
        break;
      default:
        in_RDI->lr = uVar3;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar3;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 3:
    uVar4 = (uint)(*in_RSI & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar4 < 8)) || (0xc < uVar4)) && (0xc < uVar4))
    {
      if (uVar4 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar4 < 8)) || (0xc < uVar4)) && (0xc < uVar4))
    {
      if (uVar4 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
    }
    uVar3 = arm_lsr(in_stack_fffffffffffff1d8,type,(uint32_t)in_stack_fffffffffffff1d0);
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar3 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar3 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar3);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar3;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar3;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar3;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar3;
        break;
      default:
        in_RDI->sp = uVar3;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar3;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar3;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar3;
        break;
      default:
        in_RDI->lr = uVar3;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar3;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 4:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_908 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_908 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_50c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_50c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_50c = in_RDI->sp_svc;
        break;
      default:
        local_50c = in_RDI->sp;
        break;
      case 0x17:
        local_50c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_50c = in_RDI->sp_und;
      }
      local_908 = local_50c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_30c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_30c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_30c = in_RDI->lr_svc;
        break;
      default:
        local_30c = in_RDI->lr;
        break;
      case 0x17:
        local_30c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_30c = in_RDI->lr_und;
      }
      local_908 = local_30c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_908 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_918 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_918 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4fc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4fc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4fc = in_RDI->sp_svc;
        break;
      default:
        local_4fc = in_RDI->sp;
        break;
      case 0x17:
        local_4fc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4fc = in_RDI->sp_und;
      }
      local_918 = local_4fc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2fc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2fc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2fc = in_RDI->lr_svc;
        break;
      default:
        local_2fc = in_RDI->lr;
        break;
      case 0x17:
        local_2fc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2fc = in_RDI->lr_und;
      }
      local_918 = local_2fc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_918 = in_RDI->pc;
    }
    uVar3 = arm_asr(&in_RDI->cpsr,local_908,local_918);
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar3 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar3 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar3);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar3;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar3;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar3;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar3;
        break;
      default:
        in_RDI->sp = uVar3;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar3;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar3;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar3;
        break;
      default:
        in_RDI->lr = uVar3;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar3;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 5:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_928 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_928 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4ec = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4ec = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4ec = in_RDI->sp_svc;
        break;
      default:
        local_4ec = in_RDI->sp;
        break;
      case 0x17:
        local_4ec = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4ec = in_RDI->sp_und;
      }
      local_928 = local_4ec;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2ec = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2ec = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2ec = in_RDI->lr_svc;
        break;
      default:
        local_2ec = in_RDI->lr;
        break;
      case 0x17:
        local_2ec = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2ec = in_RDI->lr_und;
      }
      local_928 = local_2ec;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_928 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_938 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_938 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4dc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4dc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4dc = in_RDI->sp_svc;
        break;
      default:
        local_4dc = in_RDI->sp;
        break;
      case 0x17:
        local_4dc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4dc = in_RDI->sp_und;
      }
      local_938 = local_4dc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2dc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2dc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2dc = in_RDI->lr_svc;
        break;
      default:
        local_2dc = in_RDI->lr;
        break;
      case 0x17:
        local_2dc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2dc = in_RDI->lr_und;
      }
      local_938 = local_2dc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_938 = in_RDI->pc;
    }
    uVar4 = local_938 + ((in_RDI->cpsr).raw >> 0x1d & 1);
    uVar2 = local_928 + uVar4;
    bVar1 = (byte)((in_RDI->cpsr).raw >> 0x1d) & 1;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xdfffffff |
         (uint)(0xffffffff < (ulong)local_928 + (ulong)uVar4 + (ulong)bVar1) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)(((ulong)(local_928 ^ local_928 + uVar4 + (uint)bVar1) &
                ((ulong)local_928 ^ 0xffffffffffffffff ^ (ulong)uVar4)) >> 0x1f != 0) << 0x1c;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar2 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar2 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar2;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar2;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar2;
        break;
      default:
        in_RDI->sp = uVar2;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar2;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar2;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar2;
        break;
      default:
        in_RDI->lr = uVar2;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar2;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 6:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_948 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_948 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4cc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4cc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4cc = in_RDI->sp_svc;
        break;
      default:
        local_4cc = in_RDI->sp;
        break;
      case 0x17:
        local_4cc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4cc = in_RDI->sp_und;
      }
      local_948 = local_4cc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2cc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2cc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2cc = in_RDI->lr_svc;
        break;
      default:
        local_2cc = in_RDI->lr;
        break;
      case 0x17:
        local_2cc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2cc = in_RDI->lr_und;
      }
      local_948 = local_2cc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_948 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_958 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_958 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4bc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4bc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4bc = in_RDI->sp_svc;
        break;
      default:
        local_4bc = in_RDI->sp;
        break;
      case 0x17:
        local_4bc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4bc = in_RDI->sp_und;
      }
      local_958 = local_4bc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2bc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2bc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2bc = in_RDI->lr_svc;
        break;
      default:
        local_2bc = in_RDI->lr;
        break;
      case 0x17:
        local_2bc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2bc = in_RDI->lr_und;
      }
      local_958 = local_2bc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_958 = in_RDI->pc;
    }
    uVar4 = (local_958 - ((in_RDI->cpsr).raw >> 0x1d & 1)) + 1;
    uVar2 = local_948 - uVar4;
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(uVar4 <= local_948) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)((local_948 ^ local_958) & (local_958 ^ 0xffffffff ^ uVar2)) < 0) << 0x1c;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar2 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar2 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar2;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar2;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar2;
        break;
      default:
        in_RDI->sp = uVar2;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar2;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar2;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar2;
        break;
      default:
        in_RDI->lr = uVar2;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar2;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 7:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_968 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_968 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4ac = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_4ac = in_RDI->sp_irq;
        break;
      case 0x13:
        local_4ac = in_RDI->sp_svc;
        break;
      default:
        local_4ac = in_RDI->sp;
        break;
      case 0x17:
        local_4ac = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_4ac = in_RDI->sp_und;
      }
      local_968 = local_4ac;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2ac = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2ac = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2ac = in_RDI->lr_svc;
        break;
      default:
        local_2ac = in_RDI->lr;
        break;
      case 0x17:
        local_2ac = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2ac = in_RDI->lr_und;
      }
      local_968 = local_2ac;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_968 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_978 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_978 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_49c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_49c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_49c = in_RDI->sp_svc;
        break;
      default:
        local_49c = in_RDI->sp;
        break;
      case 0x17:
        local_49c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_49c = in_RDI->sp_und;
      }
      local_978 = local_49c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_29c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_29c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_29c = in_RDI->lr_svc;
        break;
      default:
        local_29c = in_RDI->lr;
        break;
      case 0x17:
        local_29c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_29c = in_RDI->lr_und;
      }
      local_978 = local_29c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_978 = in_RDI->pc;
    }
    uVar3 = arm_ror(&in_RDI->cpsr,local_968,local_978);
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar3 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar3 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar3);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar3;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar3;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar3;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar3;
        break;
      default:
        in_RDI->sp = uVar3;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar3;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar3;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar3;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar3;
        break;
      default:
        in_RDI->lr = uVar3;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar3;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar3;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 8:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_988 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_988 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_48c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_48c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_48c = in_RDI->sp_svc;
        break;
      default:
        local_48c = in_RDI->sp;
        break;
      case 0x17:
        local_48c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_48c = in_RDI->sp_und;
      }
      local_988 = local_48c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_28c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_28c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_28c = in_RDI->lr_svc;
        break;
      default:
        local_28c = in_RDI->lr;
        break;
      case 0x17:
        local_28c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_28c = in_RDI->lr_und;
      }
      local_988 = local_28c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_988 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_998 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_998 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_47c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_47c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_47c = in_RDI->sp_svc;
        break;
      default:
        local_47c = in_RDI->sp;
        break;
      case 0x17:
        local_47c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_47c = in_RDI->sp_und;
      }
      local_998 = local_47c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_27c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_27c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_27c = in_RDI->lr_svc;
        break;
      default:
        local_27c = in_RDI->lr;
        break;
      case 0x17:
        local_27c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_27c = in_RDI->lr_und;
      }
      local_998 = local_27c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_998 = in_RDI->pc;
    }
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)((local_988 & local_998) == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)(local_988 & local_998) < 0) << 0x1f;
    break;
  case 9:
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9a8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9a8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_46c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_46c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_46c = in_RDI->sp_svc;
        break;
      default:
        local_46c = in_RDI->sp;
        break;
      case 0x17:
        local_46c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_46c = in_RDI->sp_und;
      }
      local_9a8 = local_46c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_26c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_26c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_26c = in_RDI->lr_svc;
        break;
      default:
        local_26c = in_RDI->lr;
        break;
      case 0x17:
        local_26c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_26c = in_RDI->lr_und;
      }
      local_9a8 = local_26c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9a8 = in_RDI->pc;
    }
    uVar4 = -local_9a8;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)(0 < (int)local_9a8) << 0x1f;
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(local_9a8 == 0) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)(local_9a8 & (local_9a8 ^ 0xffffffff ^ uVar4)) < 0) << 0x1c;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 10:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9b8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9b8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_45c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_45c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_45c = in_RDI->sp_svc;
        break;
      default:
        local_45c = in_RDI->sp;
        break;
      case 0x17:
        local_45c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_45c = in_RDI->sp_und;
      }
      local_9b8 = local_45c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_25c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_25c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_25c = in_RDI->lr_svc;
        break;
      default:
        local_25c = in_RDI->lr;
        break;
      case 0x17:
        local_25c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_25c = in_RDI->lr_und;
      }
      local_9b8 = local_25c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9b8 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9c8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9c8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_44c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_44c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_44c = in_RDI->sp_svc;
        break;
      default:
        local_44c = in_RDI->sp;
        break;
      case 0x17:
        local_44c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_44c = in_RDI->sp_und;
      }
      local_9c8 = local_44c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_24c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_24c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_24c = in_RDI->lr_svc;
        break;
      default:
        local_24c = in_RDI->lr;
        break;
      case 0x17:
        local_24c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_24c = in_RDI->lr_und;
      }
      local_9c8 = local_24c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9c8 = in_RDI->pc;
    }
    uVar4 = local_9b8 - local_9c8;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(local_9c8 <= local_9b8) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)((local_9b8 ^ local_9c8) & (local_9c8 ^ 0xffffffff ^ uVar4)) < 0) << 0x1c;
    break;
  case 0xb:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9d8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9d8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_43c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_43c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_43c = in_RDI->sp_svc;
        break;
      default:
        local_43c = in_RDI->sp;
        break;
      case 0x17:
        local_43c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_43c = in_RDI->sp_und;
      }
      local_9d8 = local_43c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_23c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_23c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_23c = in_RDI->lr_svc;
        break;
      default:
        local_23c = in_RDI->lr;
        break;
      case 0x17:
        local_23c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_23c = in_RDI->lr_und;
      }
      local_9d8 = local_23c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9d8 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9e8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9e8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_42c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_42c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_42c = in_RDI->sp_svc;
        break;
      default:
        local_42c = in_RDI->sp;
        break;
      case 0x17:
        local_42c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_42c = in_RDI->sp_und;
      }
      local_9e8 = local_42c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_22c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_22c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_22c = in_RDI->lr_svc;
        break;
      default:
        local_22c = in_RDI->lr;
        break;
      case 0x17:
        local_22c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_22c = in_RDI->lr_und;
      }
      local_9e8 = local_22c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9e8 = in_RDI->pc;
    }
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xdfffffff |
         (uint)(0xffffffff < (ulong)local_9d8 + (ulong)local_9e8) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)(((ulong)(local_9d8 ^ local_9d8 + local_9e8) &
                ((ulong)local_9d8 ^ 0xffffffffffffffff ^ (ulong)local_9e8)) >> 0x1f != 0) << 0x1c;
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_9f8 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_9f8 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_41c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_41c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_41c = in_RDI->sp_svc;
        break;
      default:
        local_41c = in_RDI->sp;
        break;
      case 0x17:
        local_41c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_41c = in_RDI->sp_und;
      }
      local_9f8 = local_41c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_21c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_21c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_21c = in_RDI->lr_svc;
        break;
      default:
        local_21c = in_RDI->lr;
        break;
      case 0x17:
        local_21c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_21c = in_RDI->lr_und;
      }
      local_9f8 = local_21c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_9f8 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a08 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a08 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_40c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_40c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_40c = in_RDI->sp_svc;
        break;
      default:
        local_40c = in_RDI->sp;
        break;
      case 0x17:
        local_40c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_40c = in_RDI->sp_und;
      }
      local_a08 = local_40c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_20c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_20c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_20c = in_RDI->lr_svc;
        break;
      default:
        local_20c = in_RDI->lr;
        break;
      case 0x17:
        local_20c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_20c = in_RDI->lr_und;
      }
      local_a08 = local_20c;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a08 = in_RDI->pc;
    }
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(local_9f8 + local_a08 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)(local_9f8 + local_a08) < 0) << 0x1f;
    break;
  case 0xc:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a18 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a18 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3fc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3fc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3fc = in_RDI->sp_svc;
        break;
      default:
        local_3fc = in_RDI->sp;
        break;
      case 0x17:
        local_3fc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3fc = in_RDI->sp_und;
      }
      local_a18 = local_3fc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1fc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1fc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1fc = in_RDI->lr_svc;
        break;
      default:
        local_1fc = in_RDI->lr;
        break;
      case 0x17:
        local_1fc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1fc = in_RDI->lr_und;
      }
      local_a18 = local_1fc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a18 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a28 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a28 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3ec = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3ec = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3ec = in_RDI->sp_svc;
        break;
      default:
        local_3ec = in_RDI->sp;
        break;
      case 0x17:
        local_3ec = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3ec = in_RDI->sp_und;
      }
      local_a28 = local_3ec;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1ec = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1ec = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1ec = in_RDI->lr_svc;
        break;
      default:
        local_1ec = in_RDI->lr;
        break;
      case 0x17:
        local_1ec = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1ec = in_RDI->lr_und;
      }
      local_a28 = local_1ec;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a28 = in_RDI->pc;
    }
    uVar4 = local_a18 | local_a28;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 0xd:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a38 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a38 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3dc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3dc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3dc = in_RDI->sp_svc;
        break;
      default:
        local_3dc = in_RDI->sp;
        break;
      case 0x17:
        local_3dc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3dc = in_RDI->sp_und;
      }
      local_a38 = local_3dc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1dc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1dc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1dc = in_RDI->lr_svc;
        break;
      default:
        local_1dc = in_RDI->lr;
        break;
      case 0x17:
        local_1dc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1dc = in_RDI->lr_und;
      }
      local_a38 = local_1dc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a38 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a48 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a48 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3cc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3cc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3cc = in_RDI->sp_svc;
        break;
      default:
        local_3cc = in_RDI->sp;
        break;
      case 0x17:
        local_3cc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3cc = in_RDI->sp_und;
      }
      local_a48 = local_3cc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1cc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1cc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1cc = in_RDI->lr_svc;
        break;
      default:
        local_1cc = in_RDI->lr;
        break;
      case 0x17:
        local_1cc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1cc = in_RDI->lr_und;
      }
      local_a48 = local_1cc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a48 = in_RDI->pc;
    }
    uVar4 = local_a38 * local_a48;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 0xe:
    uVar4 = (uint)(*in_RSI & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a58 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a58 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3bc = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3bc = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3bc = in_RDI->sp_svc;
        break;
      default:
        local_3bc = in_RDI->sp;
        break;
      case 0x17:
        local_3bc = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3bc = in_RDI->sp_und;
      }
      local_a58 = local_3bc;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1bc = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1bc = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1bc = in_RDI->lr_svc;
        break;
      default:
        local_1bc = in_RDI->lr;
        break;
      case 0x17:
        local_1bc = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1bc = in_RDI->lr_und;
      }
      local_a58 = local_1bc;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a58 = in_RDI->pc;
    }
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a68 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a68 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3ac = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_3ac = in_RDI->sp_irq;
        break;
      case 0x13:
        local_3ac = in_RDI->sp_svc;
        break;
      default:
        local_3ac = in_RDI->sp;
        break;
      case 0x17:
        local_3ac = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_3ac = in_RDI->sp_und;
      }
      local_a68 = local_3ac;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1ac = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1ac = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1ac = in_RDI->lr_svc;
        break;
      default:
        local_1ac = in_RDI->lr;
        break;
      case 0x17:
        local_1ac = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1ac = in_RDI->lr_und;
      }
      local_a68 = local_1ac;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a68 = in_RDI->pc;
    }
    uVar4 = local_a58 & (local_a68 ^ 0xffffffff);
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  case 0xf:
    uVar4 = (uint)(*in_RSI >> 3 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_a78 = in_RDI->highreg_fiq[uVar4 - 8];
    }
    else if (uVar4 < 0xd) {
      local_a78 = in_RDI->r[uVar4];
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_39c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_39c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_39c = in_RDI->sp_svc;
        break;
      default:
        local_39c = in_RDI->sp;
        break;
      case 0x17:
        local_39c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_39c = in_RDI->sp_und;
      }
      local_a78 = local_39c;
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_1a0 = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_1a0 = in_RDI->lr_irq;
        break;
      case 0x13:
        local_1a0 = in_RDI->lr_svc;
        break;
      default:
        local_1a0 = in_RDI->lr;
        break;
      case 0x17:
        local_1a0 = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_1a0 = in_RDI->lr_und;
      }
      local_a78 = local_1a0;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_a78 = in_RDI->pc;
    }
    uVar4 = local_a78 ^ 0xffffffff;
    psVar5 = get_psr(in_RDI);
    psVar5->raw = psVar5->raw & 0xbfffffff | (uint)(uVar4 == 0) << 0x1e;
    psVar5->raw = psVar5->raw & 0x7fffffff | (uint)((int)uVar4 < 0) << 0x1f;
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar4;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar4;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar4;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar4;
        break;
      default:
        in_RDI->sp = uVar4;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar4;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar4;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar4;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar4;
        break;
      default:
        in_RDI->lr = uVar4;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar4;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar4;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffff1d0,new_pc);
      }
    }
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/alu_operations.c"
            ,0x7a);
    fprintf(_stderr,"Unknown ALU operations opcode: %d\n\x1b[0;m",(ulong)(*in_RSI >> 6 & 0xf));
    exit(1);
  }
  return;
}

Assistant:

void alu_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    alu_operations_t* instr = &thminstr->ALU_OPERATIONS;
    switch (instr->opcode) {
        case 0x0: { // AND: Rd = Rd AND Rs
            word newvalue = get_register(state, instr->rd) & get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x1: { // EOR: Rd = Rd ^ Rs
            word newvalue = get_register(state, instr->rd) ^ get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x2: { // LSL: Rd = Rd << Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_shift(&state->cpsr, LSL, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x3: { // LSR: Rd = Rd >> Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_lsr(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x4: { // ASR: Rd = Rd ASR Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_asr(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x5: { // ADC: Rd = Rd + Rs + C
            uint64_t rddata = get_register(state, instr->rd);
            uint64_t rsdata = get_register(state, instr->rs) + state->cpsr.C;
            word result = rddata + rsdata;
            set_flags_adc(state, rddata, rsdata, state->cpsr.C);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0x6: { // SBC: Rd = Rd - Rs - (~C)
            word rddata = get_register(state, instr->rd);
            word rsdata = get_register(state, instr->rs);
            uint64_t tmp = rsdata - state->cpsr.C + 1;

            word result = rddata - tmp;

            set_flags_sbc(state, rddata, rsdata, tmp, result);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0x7: { // ROR: Rd = Rd ROR Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_ror(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x8: { // TST: Set condition codes on Rd AND Rs
            set_flags_nz(state, get_register(state, instr->rd) & get_register(state, instr->rs));
            break;
        }
        case 0x9: { // NEG: Rd = -Rs
            word rsdata = get_register(state, instr->rs);
            word result = 0 - rsdata;
            set_flags_nz(state, result);
            set_flags_sub(state, 0, rsdata, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0xA: { // CMP: Set condition codes on Rd - Rs
            word rddata = get_register(state, instr->rd);
            word rsdata = get_register(state, instr->rs);
            word result = rddata - rsdata;
            set_flags_nz(state, result);
            set_flags_sub(state, rddata, rsdata, result);
            break;
        }
        case 0xB: { // CMN: Set condition codes on Rd + Rs
            set_flags_add(state, get_register(state, instr->rd), get_register(state, instr->rs));
            set_flags_nz(state, get_register(state, instr->rd) + get_register(state, instr->rs));
            break;
        }
        case 0xC: { // ORR: Rd = Rd | Rs
            word newvalue = get_register(state, instr->rd) | get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0xD: { // MUL: Rd = Rd * Rs
            word result = get_register(state, instr->rd) * get_register(state, instr->rs);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0xE: { // BIC: Rd = Rd & ~Rs
            word newvalue = get_register(state, instr->rd) & ~get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0xF: { // MVN: Rd = ~Rs
            word newvalue = ~get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        default:
            logfatal("Unknown ALU operations opcode: %d", instr->opcode)
    }
}